

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O3

PktOut * ssh2_portfwd_chanopen
                   (ssh2_connection_state *s,ssh2_channel *c,char *hostname,int port,
                   char *description,SocketPeerInfo *pi)

{
  BinarySink *bs;
  char *pcVar1;
  PktOut *pPVar2;
  unsigned_long val;
  LogContext *ctx;
  
  if ((pi == (SocketPeerInfo *)0x0) || (pi->log_text == (char *)0x0)) {
    ctx = (s->ppl).logctx;
    pcVar1 = dupprintf("Forwarding connection to listening port %s:%d",hostname,(ulong)(uint)port);
  }
  else {
    ctx = (s->ppl).logctx;
    pcVar1 = dupprintf("Forwarding connection to listening port %s:%d from %s",hostname,
                       (ulong)(uint)port);
  }
  logevent_and_free(ctx,pcVar1);
  pPVar2 = ssh2_chanopen_init(c,"forwarded-tcpip");
  bs = pPVar2->binarysink_;
  BinarySink_put_stringz(bs,hostname);
  BinarySink_put_uint32(bs,(long)port);
  if (pi == (SocketPeerInfo *)0x0) {
    BinarySink_put_stringz(bs,"0.0.0.0");
    val = 0;
  }
  else {
    pcVar1 = "0.0.0.0";
    if (pi->addr_text != (char *)0x0) {
      pcVar1 = pi->addr_text;
    }
    BinarySink_put_stringz(bs,pcVar1);
    val = 0;
    if (0 < pi->port) {
      val = (unsigned_long)(uint)pi->port;
    }
  }
  BinarySink_put_uint32(bs,val);
  return pPVar2;
}

Assistant:

PktOut *ssh2_portfwd_chanopen(
    struct ssh2_connection_state *s, struct ssh2_channel *c,
    const char *hostname, int port,
    const char *description, const SocketPeerInfo *pi)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktOut *pktout;

    /*
     * In server mode, this function is called by portfwdmgr in
     * response to PortListeners that were set up by calling
     * portfwdmgr_listen, which means that the hostname and port
     * parameters will identify the listening socket on which a
     * connection just came in.
     */

    if (pi && pi->log_text)
        ppl_logevent("Forwarding connection to listening port %s:%d from %s",
                     hostname, port, pi->log_text);
    else
        ppl_logevent("Forwarding connection to listening port %s:%d",
                     hostname, port);

    pktout = ssh2_chanopen_init(c, "forwarded-tcpip");
    put_stringz(pktout, hostname);
    put_uint32(pktout, port);
    put_stringz(pktout, (pi && pi->addr_text ? pi->addr_text : "0.0.0.0"));
    put_uint32(pktout, (pi && pi->port >= 0 ? pi->port : 0));

    return pktout;
}